

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value),_uintwide_t<16384U,_unsigned_int,_allocator<unsigned_int>_>_>
* __thiscall
math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::operator<<=
          (uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false> *this,int n)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  if (n < 0) {
    operator>>=(this,-n);
  }
  else if (n != 0) {
    if ((uint)n < 0x4000) {
      uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::shl<int>
                ((uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)this,n);
    }
    else {
      lVar2 = *(long *)(this + 0x10);
      uVar1 = *(uint *)(this + 8);
      for (lVar3 = 0; (ulong)uVar1 << 2 != lVar3; lVar3 = lVar3 + 4) {
        *(undefined4 *)(lVar2 + lVar3) = 0;
      }
    }
  }
  return (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value),_uintwide_t<16384U,_unsigned_int,_allocator<unsigned_int>_>_>
          *)this;
}

Assistant:

constexpr auto operator<<=(const SignedIntegralType n) -> std::enable_if_t<(   std::is_integral<SignedIntegralType>::value
                                                                                && std::is_signed  <SignedIntegralType>::value), uintwide_t>&
    {
      // Implement left-shift operator for signed integral argument.
      if(n < static_cast<SignedIntegralType>(0))
      {
        using local_unsigned_type =
          typename detail::uint_type_helper<static_cast<size_t>(std::numeric_limits<SignedIntegralType>::digits + 1)>::exact_unsigned_type;

        operator>>=(static_cast<local_unsigned_type>(detail::negate(n)));
      }
      else if(n > static_cast<SignedIntegralType>(0))
      {
        if(exceeds_width(n))
        {
          // Exclude this line from code coverage, even though explicit
          // test cases (search for "result_overshift_is_ok") are known
          // to cover this line.
          detail::fill_unsafe(values.begin(), values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
        }
        else
        {
          shl(n);
        }
      }

      return *this;
    }